

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_codecvt.cxx
# Opt level: O0

result __thiscall
codecvt::do_unshift(codecvt *this,mbstate_t *state,char *to,char *to_end,char **to_next)

{
  char **to_next_local;
  char *to_end_local;
  char *to_local;
  mbstate_t *state_local;
  codecvt *this_local;
  
  *to_next = to;
  if ((this->m_noconv & 1U) == 0) {
    this_local._4_4_ = ok;
  }
  else {
    this_local._4_4_ = noconv;
  }
  return this_local._4_4_;
}

Assistant:

std::codecvt_base::result codecvt::do_unshift(mbstate_t& state, char* to,
                                              char* to_end,
                                              char*& to_next) const
{
  to_next = to;
  if (m_noconv) {
    return std::codecvt_base::noconv;
  }
#if defined(_WIN32)
  State& lstate = reinterpret_cast<State&>(state);
  if (lstate.buffered != 0) {
    return this->DecodePartial(state, to_next, to_end);
  }
  return std::codecvt_base::ok;
#else
  static_cast<void>(state);
  static_cast<void>(to_end);
  return std::codecvt_base::ok;
#endif
}